

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O3

void __thiscall TcpServer::daemonRun(TcpServer *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  uint32_t *puVar4;
  int iVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  long lVar8;
  _Base_ptr p_Var9;
  const_iterator __position;
  map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
  *this_00;
  TcpServer *pTVar10;
  bool bVar11;
  uint uVar12;
  WriteContentResult WVar13;
  epoll_event *__events;
  char *__args_1;
  pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *__args;
  mapped_type *__args_00;
  _Base_ptr p_Var14;
  int *piVar15;
  const_iterator cVar16;
  undefined8 uVar17;
  _Base_ptr p_Var18;
  uint __fd;
  ulong uVar19;
  _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
  *p_Var20;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
  pVar21;
  string local_88;
  _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
  *local_68;
  string *local_60;
  map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
  *local_58;
  _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
  *local_50;
  _Map_pointer local_48;
  uint local_3c;
  TcpServer *pTStack_38;
  int fd;
  
  __events = (epoll_event *)operator_new__(0x3000);
  local_50 = (_Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
              *)&this->toWriteContents;
  local_58 = &this->connections;
  p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
  local_68 = (_Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
              *)&this->inActiveWriteContents;
  local_60 = &this->errorString;
  p_Var2 = &(this->inActiveWriteContents)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &(this->closeWhenWriteFinish)._M_t._M_impl.super__Rb_tree_header;
  pTStack_38 = this;
  while( true ) {
    while( true ) {
      uVar12 = epoll_wait(pTStack_38->epollFd,__events,0x400,
                          -(uint)((pTStack_38->toWriteContents)._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count == 0));
      if (-1 < (int)uVar12) break;
      recordError(pTStack_38,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0x230);
      Logger::printLog(&logger,LOG_ERROR,local_60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                       ,0x231);
    }
    if (uVar12 != 0) break;
LAB_00105727:
    cVar16._M_node =
         (pTStack_38->toWriteContents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var20 = local_50;
    while (__position._M_node = cVar16._M_node,
          (_Rb_tree_header *)__position._M_node !=
          &(this->toWriteContents)._M_t._M_impl.super__Rb_tree_header) {
      __args = (pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *)
               (__position._M_node + 1);
      WVar13 = writeContent(pTStack_38,__position._M_node[1]._M_color);
      if (WVar13 == Move_to_Inactive) {
        std::
        _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
        ::_M_emplace_unique<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>&>
                  (local_68,__args);
LAB_00105866:
        cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        goto LAB_00105871;
      }
      if (WVar13 == OK) {
        p_Var14 = (pTStack_38->closeWhenWriteFinish)._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_parent;
        if (p_Var14 == (_Base_ptr)0x0) {
LAB_001057ba:
          if ((pTStack_38->onCanWriteHandler).super__Function_base._M_manager != (_Manager_type)0x0)
          {
            local_88._M_dataplus._M_p =
                 (pointer)std::
                          map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                          ::operator[](local_58,(key_type *)__args);
            local_48 = (_Map_pointer)pTStack_38->data;
            if ((pTStack_38->onCanWriteHandler).super__Function_base._M_manager ==
                (_Manager_type)0x0) {
LAB_001058d1:
              uVar17 = std::__throw_bad_function_call();
              if ((pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *)
                  local_88._M_dataplus._M_p != __args) {
                operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1
                               );
              }
              _Unwind_Resume(uVar17);
            }
            (*(pTStack_38->onCanWriteHandler)._M_invoker)
                      ((_Any_data *)&this->onCanWriteHandler,(TcpConnection **)&local_88,&local_48);
          }
        }
        else {
          iVar5 = __args->first;
          p_Var18 = &p_Var3->_M_header;
          do {
            if (iVar5 <= (int)*(size_t *)(p_Var14 + 1)) {
              p_Var18 = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[(int)*(size_t *)(p_Var14 + 1) < iVar5];
          } while (p_Var14 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)p_Var18 == p_Var3) ||
             (iVar5 < (int)((_Rb_tree_header *)p_Var18)->_M_node_count)) goto LAB_001057ba;
        }
        p_Var14 = __position._M_node[3]._M_left;
        p_Var18 = __position._M_node[2]._M_left;
        p_Var6 = __position._M_node[2]._M_parent;
        p_Var7 = __position._M_node[2]._M_right;
        lVar8 = *(long *)(__position._M_node + 3);
        p_Var9 = __position._M_node[1]._M_right;
        cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
        p_Var20 = local_50;
        if (((long)p_Var6 - (long)p_Var9 >> 5) +
            ((long)p_Var7 - lVar8 >> 5) +
            ((((ulong)((long)p_Var14 - (long)p_Var18) >> 3) - 1) +
            (ulong)(p_Var14 == (_Base_ptr)0x0)) * 0x10 == 0) {
LAB_00105871:
          std::
          _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
          ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                          *)p_Var20,__position);
        }
      }
      else {
        cVar16._M_node = __position._M_node;
        if (WVar13 == DeleteConnection) {
          closeConnection(pTStack_38,__args->first);
          goto LAB_00105866;
        }
      }
    }
  }
  uVar19 = 0;
LAB_001053a6:
  pTVar10 = pTStack_38;
  puVar4 = &__events->events + uVar19 * 3;
  printEvent(pTStack_38,*(int *)(&__events->field_0x4 + uVar19 * 0xc),
             (&__events->events)[uVar19 * 3]);
  __fd = *(uint *)(&__events->field_0x4 + uVar19 * 0xc);
  __args = (pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *)(ulong)__fd;
  if (__fd == pTVar10->serverFd) {
    if (((*puVar4 & 1) != 0) && (bVar11 = acceptNewConnection(pTStack_38), !bVar11)) {
      recordError(pTStack_38,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                  ,0x239);
      Logger::printLog(&logger,LOG_ERROR,local_60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                       ,0x23a);
    }
  }
  else if (__fd == pTStack_38->pipeFds[0]) {
    if ((*puVar4 & 1) != 0) {
      handleNotify(pTStack_38);
    }
  }
  else {
    p_Var14 = (pTStack_38->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var18 = &p_Var1->_M_header;
    local_3c = __fd;
    if (p_Var14 != (_Base_ptr)0x0) {
      do {
        if ((int)__fd <= (int)*(size_t *)(p_Var14 + 1)) {
          p_Var18 = p_Var14;
        }
        p_Var14 = (&p_Var14->_M_left)[(int)*(size_t *)(p_Var14 + 1) < (int)__fd];
      } while (p_Var14 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var18 != p_Var1) &&
         ((int)((_Rb_tree_header *)p_Var18)->_M_node_count <= (int)__fd)) {
        if ((*puVar4 & 0x11) == 0) {
          p_Var14 = (pTStack_38->inActiveWriteContents)._M_t._M_impl.super__Rb_tree_header._M_header
                    ._M_parent;
          cVar16._M_node = &p_Var2->_M_header;
          if (p_Var14 == (_Base_ptr)0x0 || (*puVar4 & 4) == 0) goto LAB_001054e8;
          do {
            if ((int)__fd <= (int)p_Var14[1]._M_color) {
              cVar16._M_node = p_Var14;
            }
            p_Var14 = (&p_Var14->_M_left)[(int)p_Var14[1]._M_color < (int)__fd];
          } while (p_Var14 != (_Base_ptr)0x0);
          if (((_Rb_tree_header *)cVar16._M_node != p_Var2) &&
             ((int)cVar16._M_node[1]._M_color <= (int)__fd)) {
            std::
            _Rb_tree<int,std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>,std::_Select1st<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>,std::less<int>,std::allocator<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>>>
            ::
            _M_emplace_unique<std::pair<int_const,std::deque<WriteMeta,std::allocator<WriteMeta>>>&>
                      (local_50,(pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>
                                 *)(cVar16._M_node + 1));
            std::
            _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
            ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                            *)local_68,cVar16);
            local_88._M_dataplus._M_p =
                 (pointer)std::
                          map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                          ::operator[](local_58,(key_type *)&local_3c);
            local_48 = (_Map_pointer)pTStack_38->data;
            if ((pTStack_38->onCanWriteHandler).super__Function_base._M_manager ==
                (_Manager_type)0x0) goto LAB_001058d1;
            (*(pTStack_38->onCanWriteHandler)._M_invoker)
                      ((_Any_data *)&this->onCanWriteHandler,(TcpConnection **)&local_88,&local_48);
          }
        }
        else {
          __args_1 = (char *)operator_new__(0x14000);
          while (__args = (pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_> *)
                          read(__fd,__args_1,0x14000), this_00 = local_58, 0 < (long)__args) {
            __fd = local_3c;
            if ((pTStack_38->onReadHandler).super__Function_base._M_manager != (_Manager_type)0x0) {
              std::
              map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
              ::operator[](local_58,(key_type *)&local_3c);
              __args_00 = std::
                          map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                          ::operator[](this_00,(key_type *)&local_3c);
              std::function<void_(const_TcpConnection_*,_const_char_*,_unsigned_long,_void_*)>::
              operator()(&this->onReadHandler,__args_00,__args_1,(unsigned_long)__args,
                         pTStack_38->data);
              __fd = local_3c;
            }
          }
          if ((long)__args < 0) {
            piVar15 = __errno_location();
            if (*piVar15 != 0xb) {
              recordError(pTStack_38,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                          ,600);
              Logger::printLog(&logger,LOG_ERROR,local_60,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                               ,0x259);
            }
          }
          else {
            if ((pTStack_38->onPeerShutdownHandler).super__Function_base._M_manager !=
                (_Manager_type)0x0) {
              local_88._M_dataplus._M_p =
                   (pointer)std::
                            map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
                            ::operator[](local_58,(key_type *)&local_3c);
              local_48 = (_Map_pointer)pTStack_38->data;
              if ((pTStack_38->onPeerShutdownHandler).super__Function_base._M_manager ==
                  (_Manager_type)0x0) goto LAB_001058d1;
              (*(pTStack_38->onPeerShutdownHandler)._M_invoker)
                        ((_Any_data *)&this->onPeerShutdownHandler,(TcpConnection **)&local_88,
                         &local_48);
            }
            p_Var20 = local_50;
            pVar21 = std::
                     _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                     ::equal_range((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                                    *)local_50,(key_type *)&local_3c);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
            ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                            *)p_Var20,(_Base_ptr)pVar21.first._M_node,
                           (_Base_ptr)pVar21.second._M_node);
            p_Var20 = local_68;
            pVar21 = std::
                     _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                     ::equal_range((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                                    *)local_68,(key_type *)&local_3c);
            std::
            _Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
            ::_M_erase_aux((_Rb_tree<int,_std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>,_std::_Select1st<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::deque<WriteMeta,_std::allocator<WriteMeta>_>_>_>_>
                            *)p_Var20,(_Base_ptr)pVar21.first._M_node,
                           (_Base_ptr)pVar21.second._M_node);
          }
          operator_delete__(__args_1);
        }
        goto LAB_001054e8;
      }
    }
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"fd not seen before","");
    Logger::printLog(&logger,LOG_ERROR,&local_88,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                     ,0x246);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
  }
LAB_001054e8:
  uVar19 = uVar19 + 1;
  if (uVar19 == uVar12) goto LAB_00105727;
  goto LAB_001053a6;
}

Assistant:

void daemonRun() {
    struct epoll_event *toHandleEvents;
    toHandleEvents = new struct epoll_event[1024];
    assert(toHandleEvents);
    for (;;) {
      int epollRet = -1;
      if (toWriteContents.empty()) {
        // 没有需要写的，阻塞等待
        epollRet = epoll_wait(epollFd, toHandleEvents, 1024, -1);
      } else {
        epollRet = epoll_wait(epollFd, toHandleEvents, 1024,
                              0);  // 立刻返回，用于write
      }
      if (epollRet < 0) {
        recordError(__FILE__, __LINE__);
        Log(logger, Logger::LOG_ERROR, errorString);
      } else {
        for (int i = 0; i < epollRet; ++i) {
          printEvent(toHandleEvents[i].data.fd, toHandleEvents[i].events);
          // 监听的serverFd
          if (toHandleEvents[i].data.fd == serverFd) {
            if (toHandleEvents[i].events & EPOLLIN) {
              if (!acceptNewConnection()) {
                recordError(__FILE__, __LINE__);
                Log(logger, Logger::LOG_ERROR, errorString);
              }
            }
          } else if (toHandleEvents[i].data.fd == pipeFds[0]) {
            // 调用者通知管道fd
            if (toHandleEvents[i].events & EPOLLIN) {
              handleNotify();
            }
          } else {
            // 处理客户端的连接
            int fd = toHandleEvents[i].data.fd;
            if (connections.find(fd) == connections.end()) {
              Log(logger, Logger::LOG_ERROR, "fd not seen before");
              continue;
            }
            if (toHandleEvents[i].events & EPOLLIN ||
                toHandleEvents[i].events & EPOLLHUP) {
              char *buffer = nullptr;
              buffer = new char[BUFFER_SIZE];
              assert(buffer);
              ssize_t number = -1;
              while ((number = read(fd, buffer, BUFFER_SIZE)) > 0) {
                if (onReadHandler) {
                  auto c = connections[fd];
                  onReadHandler(&(connections[fd]), buffer, number, data);
                }
              }
              if (number < 0) {
                if (errno == EAGAIN) {
                } else {
                  recordError(__FILE__, __LINE__);
                  Log(logger, Logger::LOG_ERROR, errorString);
                }
              } else if (number == 0) {
                // 对端关闭了连接，通知调用者
                // closeConnection(fd);
                if (onPeerShutdownHandler) {
                  onPeerShutdownHandler(&(connections[fd]), data);
                }
                // 删除write队列中的数据
                toWriteContents.erase(fd);
                inActiveWriteContents.erase(fd);
              }
              delete[] buffer;
            } else if (toHandleEvents[i].events & EPOLLOUT) {
              auto index = inActiveWriteContents.find(fd);
              if (index != inActiveWriteContents.end()) {
                toWriteContents.insert(*index);
                inActiveWriteContents.erase(index);
                onCanWriteHandler(&connections[fd], data);
              }
            }
          }
        }
        // 处理write
        for (auto index = toWriteContents.begin();
             index != toWriteContents.end();) {
          WriteContentResult result = writeContent(index->first);
          if (result == WriteContentResult::DeleteConnection) {
            // 关闭连接
            closeConnection(index->first);
            // 删除要写的数据
            index = toWriteContents.erase(index);
          } else if (result == WriteContentResult::Move_to_Inactive) {
            inActiveWriteContents.insert(*index);
            index = toWriteContents.erase(index);
          } else if (result == WriteContentResult::OK) {
            if (closeWhenWriteFinish.find(index->first) ==
                closeWhenWriteFinish.cend()) {
              if (onCanWriteHandler) {
                onCanWriteHandler(&(connections[index->first]), data);
              }
            }
            if (index->second.size() == 0) {
              index = toWriteContents.erase(index);
            } else {
              ++index;
            }
          }
        }
      }
    }
  }